

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O3

zip_int64_t
winzip_aes_decrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  zip_uint8_t *password;
  _Bool _Var1;
  zip_uint64_t zVar2;
  size_t password_length;
  zip_winzip_aes_t *ctx;
  zip_int64_t zVar3;
  zip_uint64_t zVar4;
  long lVar5;
  ulong uVar6;
  int ze;
  zip_stat_t *st;
  zip_uint8_t header [18];
  short local_42;
  undefined6 uStack_40;
  short local_3a;
  long local_38;
  short local_30 [8];
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    zVar4 = 10;
    if (*(short *)((long)ud + 8) != 0x101) {
      zVar4 = (ulong)(*(short *)((long)ud + 8) != 0x102) * 4 + 0xe;
    }
    zVar2 = zip_source_read(src,&local_38,zVar4);
    if ((long)zVar2 < 0) goto LAB_00110e08;
    if (zVar2 == zVar4) {
      password = *ud;
      password_length = strlen((char *)password);
      ctx = _zip_winzip_aes_new(password,password_length,(zip_uint8_t *)&local_38,
                                *(zip_uint16_t *)((long)ud + 8),(zip_uint8_t *)&local_42,
                                (zip_error_t *)((long)ud + 0x28));
      *(zip_winzip_aes_t **)((long)ud + 0x20) = ctx;
      if (ctx == (zip_winzip_aes_t *)0x0) {
        return -1;
      }
      lVar5 = 8;
      if (*(short *)((long)ud + 8) != 0x101) {
        lVar5 = (ulong)(*(short *)((long)ud + 8) != 0x102) * 4 + 0xc;
      }
      if (local_42 == *(short *)((long)local_30 + lVar5 + -8)) {
        *(undefined8 *)((long)ud + 0x18) = 0;
        return 0;
      }
      _zip_winzip_aes_free(ctx);
      *(undefined8 *)((long)ud + 0x20) = 0;
      ze = 0x1b;
    }
    else {
      ze = 0x11;
    }
    break;
  case ZIP_SOURCE_READ:
    uVar6 = *(long *)((long)ud + 0x10) - *(long *)((long)ud + 0x18);
    if (len <= uVar6) {
      uVar6 = len;
    }
    if (uVar6 == 0) {
      zVar3 = zip_source_read(src,&local_42,10);
      if (zVar3 < 10) goto LAB_00110e08;
      _Var1 = _zip_winzip_aes_finish
                        (*(zip_winzip_aes_t **)((long)ud + 0x20),(zip_uint8_t *)&local_38);
      if (_Var1) {
        _zip_winzip_aes_free(*(zip_winzip_aes_t **)((long)ud + 0x20));
        *(undefined8 *)((long)ud + 0x20) = 0;
        if (local_3a == local_30[0] && CONCAT62(uStack_40,local_42) == local_38) {
          return 0;
        }
        ze = 7;
        break;
      }
    }
    else {
      zVar4 = zip_source_read(src,data,uVar6);
      if ((long)zVar4 < 0) {
LAB_00110e08:
        _zip_error_set_from_source((zip_error_t *)((long)ud + 0x28),src);
        return -1;
      }
      *(long *)((long)ud + 0x18) = *(long *)((long)ud + 0x18) + zVar4;
      _Var1 = _zip_winzip_aes_decrypt
                        (*(zip_winzip_aes_t **)((long)ud + 0x20),(zip_uint8_t *)data,zVar4);
      if (_Var1) {
        return zVar4;
      }
    }
    ze = 0x14;
    break;
  case ZIP_SOURCE_CLOSE:
    return 0;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 0;
    uVar6 = *data;
    *(ulong *)data = uVar6 | 0x80;
    if ((uVar6 & 8) != 0) {
      lVar5 = -0x14;
      if (*(short *)((long)ud + 8) != 0x101) {
        lVar5 = (ulong)(*(short *)((long)ud + 8) == 0x102) * 4 + -0x1c;
      }
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + lVar5;
      return 0;
    }
    return 0;
  case ZIP_SOURCE_ERROR:
    zVar3 = zip_error_to_data((zip_error_t *)((long)ud + 0x28),data,len);
    return zVar3;
  case ZIP_SOURCE_FREE:
    winzip_aes_free((winzip_aes *)ud);
    return 0;
  default:
    ze = 0x12;
    break;
  case ZIP_SOURCE_SUPPORTS:
    zVar3 = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0xffffffff);
    return zVar3;
  }
  zip_error_set((zip_error_t *)((long)ud + 0x28),ze,0);
  return -1;
}

Assistant:

static zip_int64_t
winzip_aes_decrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct winzip_aes *ctx;
    zip_int64_t n;

    ctx = (struct winzip_aes *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
	if (decrypt_header(src, ctx) < 0) {
	    return -1;
	}
	ctx->current_position = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ctx->data_length - ctx->current_position) {
	    len = ctx->data_length - ctx->current_position;
	}

	if (len == 0) {
	    if (!verify_hmac(src, ctx)) {
		return -1;
	    }
	    return 0;
	}

	if ((n = zip_source_read(src, data, len)) < 0) {
	    _zip_error_set_from_source(&ctx->error, src);
	    return -1;
	}
	ctx->current_position += (zip_uint64_t)n;

	if (!_zip_winzip_aes_decrypt(ctx->aes_ctx, (zip_uint8_t *)data, (zip_uint64_t)n)) {
	    zip_error_set(&ctx->error, ZIP_ER_INTERNAL, 0);
	    return -1;
	}

	return n;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	st = (zip_stat_t *)data;

	st->encryption_method = ZIP_EM_NONE;
	st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
	if (st->valid & ZIP_STAT_COMP_SIZE) {
	    st->comp_size -= 12 + SALT_LENGTH(ctx->encryption_method);
	}

	return 0;
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, -1);

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	winzip_aes_free(ctx);
	return 0;

    default:
	zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	return -1;
    }
}